

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divider_tests.cpp
# Opt level: O3

void __thiscall
DividerTest_Long_DivideBy_Long_Test::~DividerTest_Long_DivideBy_Long_Test
          (DividerTest_Long_DivideBy_Long_Test *this)

{
  pointer plVar1;
  
  (this->super_DividerTest).super_Test._vptr_Test = (_func_int **)&PTR__DividerTest_001541f8;
  plVar1 = (this->super_DividerTest).remainders.
           super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
           ._M_start;
  if (plVar1 != (pointer)0x0) {
    operator_delete(plVar1);
  }
  plVar1 = (this->super_DividerTest).divisions.
           super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
           ._M_start;
  if (plVar1 != (pointer)0x0) {
    operator_delete(plVar1);
  }
  plVar1 = (this->super_DividerTest).denominators.
           super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
           ._M_start;
  if (plVar1 != (pointer)0x0) {
    operator_delete(plVar1);
  }
  plVar1 = (this->super_DividerTest).numerators.
           super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
           ._M_start;
  if (plVar1 != (pointer)0x0) {
    operator_delete(plVar1);
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(DividerTest, Long_DivideBy_Long) {
  verify(3);
}